

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O0

void __thiscall
libtorrent::aux::link::insert<libtorrent::aux::torrent>
          (link *this,vector<libtorrent::aux::torrent_*> *list,torrent *self)

{
  size_type sVar1;
  torrent *local_20;
  torrent *self_local;
  vector<libtorrent::aux::torrent_*> *list_local;
  link *this_local;
  
  if (this->index < 0) {
    local_20 = self;
    self_local = (torrent *)list;
    list_local = (vector<libtorrent::aux::torrent_*> *)this;
    ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
    push_back(&list->
               super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
              ,&local_20);
    sVar1 = ::std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>::
            size((vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_> *)
                 self_local);
    this->index = (int)sVar1 + -1;
  }
  return;
}

Assistant:

void insert(aux::vector<T*>& list, T* self)
		{
			if (index >= 0) return;
			TORRENT_ASSERT(index == -1);
			list.push_back(self);
			index = int(list.size()) - 1;
		}